

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpServerImpl::Delete(TcpServerImpl *this)

{
  size_type sVar1;
  reference pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator local_48;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  const_iterator local_18;
  TcpServerImpl *local_10;
  TcpServerImpl *this_local;
  
  local_10 = this;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_vSock);
    if (sVar1 == 0) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_vSock,0);
    close(*pvVar2);
    local_20._M_current = (int *)std::begin<std::vector<int,std::allocator<int>>>(&this->m_vSock);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_18,
               &local_20);
    lock._M_device =
         (mutex_type *)std::vector<int,_std::allocator<int>_>::erase(&this->m_vSock,local_18);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->m_mtAcceptList);
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_vSockAccept);
    if (sVar1 == 0) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_vSockAccept,0);
    shutdown(*pvVar2,2);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_vSockAccept,0);
    close(*pvVar2);
    local_50._M_current =
         (int *)std::begin<std::vector<int,std::allocator<int>>>(&this->m_vSockAccept);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_48,
               &local_50);
    std::vector<int,_std::allocator<int>_>::erase(&this->m_vSockAccept,local_48);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void TcpServerImpl::Delete()
{
    while (m_vSock.size())
    {
        ::closesocket(m_vSock[0]);
        m_vSock.erase(begin(m_vSock));
    }

    lock_guard<mutex> lock(m_mtAcceptList);
    while (m_vSockAccept.size())
    {
        ::shutdown(m_vSockAccept[0], SD_BOTH);
        ::closesocket(m_vSockAccept[0]);
        m_vSockAccept.erase(begin(m_vSockAccept));
    }
}